

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

RegOpnd * __thiscall IR::Instr::FindRegDef(Instr *this,StackSym *sym)

{
  bool bVar1;
  Opnd *this_00;
  RegOpnd *regOpnd;
  Opnd *dst;
  StackSym *sym_local;
  Instr *this_local;
  
  this_00 = GetDst(this);
  if (((this_00 == (Opnd *)0x0) || (bVar1 = Opnd::IsRegOpnd(this_00), !bVar1)) ||
     (this_local = (Instr *)Opnd::AsRegOpnd(this_00), this_local->m_next != (Instr *)sym)) {
    this_local = (Instr *)0x0;
  }
  return (RegOpnd *)this_local;
}

Assistant:

IR::RegOpnd *
Instr::FindRegDef(StackSym *sym)
{
    IR::Opnd *dst = this->GetDst();

    if (dst)
    {
        if (dst->IsRegOpnd())
        {
            RegOpnd *regOpnd = dst->AsRegOpnd();

            if (regOpnd->m_sym == sym)
            {
                return regOpnd;
            }
        }
    }

    return nullptr;
}